

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O1

uint __thiscall antlr::InputBuffer::mark(InputBuffer *this)

{
  pointer __src;
  pointer piVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t __n;
  pointer piVar6;
  
  uVar5 = (ulong)this->numToConsume;
  if (uVar5 != 0) {
    if (this->nMarkers == 0) {
      piVar6 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar2 = (this->queue).m_offset;
      uVar3 = ((long)piVar1 - (long)piVar6 >> 2) - uVar2;
      if (uVar5 <= uVar3) {
        uVar3 = uVar5;
      }
      if (uVar2 < 5000) {
        sVar4 = uVar3 + uVar2;
      }
      else {
        __src = piVar6 + uVar2 + uVar3;
        if (piVar6 != __src) {
          __n = (long)piVar1 - (long)__src;
          if (__n != 0) {
            memmove(piVar6,__src,__n);
          }
          piVar1 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar6 = (pointer)((long)piVar6 + ((long)piVar1 - (long)__src));
          if (piVar1 != piVar6) {
            (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar6;
          }
        }
        sVar4 = 0;
      }
      (this->queue).m_offset = sVar4;
    }
    else {
      this->markerOffset = this->markerOffset + this->numToConsume;
    }
    this->numToConsume = 0;
  }
  this->nMarkers = this->nMarkers + 1;
  return this->markerOffset;
}

Assistant:

unsigned int InputBuffer::mark()
{
	syncConsume();
	nMarkers++;
	return markerOffset;
}